

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_BnB_Node.h
# Opt level: O2

Index __thiscall BGIP_BnB_Node::GetSpecifiedAction(BGIP_BnB_Node *this,Index agI,Index depth_tI)

{
  ostream *poVar1;
  E *pEVar2;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  while( true ) {
    if (this->_m_depth == depth_tI) {
      return (this->_m_specifiedActions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[agI];
    }
    if (this->_m_depth <= depth_tI) break;
    this = (this->_m_parent).px;
    if (this == (element_type *)0x0) {
      std::__cxx11::stringstream::stringstream(asStack_198);
      poVar1 = std::operator<<(local_188,
                               "asking parent value, but this node (at depth/that specifies ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," joint actions (for as many joint types) ) has no parent!");
      pEVar2 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar2,(stringstream *)asStack_198);
      __cxa_throw(pEVar2,&E::typeinfo,E::~E);
    }
  }
  pEVar2 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar2,"Error asking node for action at a deeper level!");
  __cxa_throw(pEVar2,&E::typeinfo,E::~E);
}

Assistant:

Index GetSpecifiedAction(Index agI, Index depth_tI) const
    { 
        size_t d = this->GetDepth();
        if( depth_tI == d )
            return _m_specifiedActions[agI];
        else if (depth_tI < d)
        {
            if(_m_parent == 0)
            {
                std::stringstream ss;
                ss << "asking parent value, but this node (at depth/that specifies "<<_m_depth<<" joint actions (for as many joint types) ) has no parent!";
                throw E(ss);
            }
            return _m_parent->GetSpecifiedAction(agI, depth_tI);
        }
        else
            throw E("Error asking node for action at a deeper level!");
    }